

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O2

int lnextkey(lua_State *L)

{
  uint8_t *puVar1;
  uint uVar2;
  int iVar3;
  uint32_t keyhash;
  size_t in_RAX;
  table *tbl;
  lua_Integer lVar4;
  ulong uVar5;
  node *pnVar6;
  uint key;
  int in_ESI;
  ulong n;
  char *str;
  size_t sz_00;
  size_t sz;
  
  sz = in_RAX;
  tbl = get_table(L,in_ESI);
  iVar3 = lua_type(L,2);
  if (iVar3 < 1) {
    if ((long)tbl->sizearray < 1) {
LAB_0011fbda:
      iVar3 = pushfirsthash(L,tbl);
      return iVar3;
    }
    uVar5 = 0;
    do {
      if ((long)tbl->sizearray == uVar5) goto LAB_0011fbda;
      n = uVar5 + 1;
      puVar1 = tbl->arraytype + uVar5;
      uVar5 = n;
    } while (*puVar1 == '\0');
LAB_0011fb60:
    lua_pushinteger(L,n);
  }
  else {
    iVar3 = lua_type(L,2);
    sz = 0;
    if (iVar3 == 3) {
      uVar2 = tbl->sizearray;
      iVar3 = lua_isinteger(L,2);
      if (iVar3 == 0) {
        return 0;
      }
      sz_00 = 0;
      lVar4 = lua_tointegerx(L,2,(int *)0x0);
      keyhash = (uint32_t)lVar4;
      iVar3 = 0;
      str = (char *)0x0;
      key = keyhash;
      if ((int)keyhash <= (int)uVar2 && 0 < (int)keyhash) {
        uVar5 = (ulong)(keyhash & 0x7fffffff);
        do {
          if (uVar2 <= uVar5) {
            iVar3 = pushfirsthash(L,tbl);
            return iVar3;
          }
          n = uVar5 + 1;
          puVar1 = tbl->arraytype + uVar5;
          uVar5 = n;
        } while (*puVar1 == '\0');
        goto LAB_0011fb60;
      }
    }
    else {
      iVar3 = 1;
      str = luaL_checklstring(L,2,&sz);
      sz_00 = sz;
      keyhash = calchash(str,sz);
      key = 0;
    }
    pnVar6 = lookup_key(tbl,keyhash,key,iVar3,str,sz_00);
    if (pnVar6 == (node *)0x0) {
      return 0;
    }
    if (tbl->sizehash == (int)(((long)(pnVar6 + 1) - (long)tbl->hash) / 0x18)) {
      return 0;
    }
    pushkey(L,tbl->L,pnVar6 + 1);
  }
  return 1;
}

Assistant:

static int
lnextkey(lua_State *L) {
	struct table *tbl = get_table(L,1);
	if (lua_isnoneornil(L,2)) {
		if (tbl->sizearray > 0) {
			int i;
			for (i=0;i<tbl->sizearray;i++) {
				if (tbl->arraytype[i] != VALUETYPE_NIL) {
					lua_pushinteger(L, i+1);
					return 1;
				}
			}
		}
		return pushfirsthash(L, tbl);
	}
	int kt = lua_type(L,2);
	uint32_t keyhash;
	int key = 0;
	int keytype;
	size_t sz=0;
	const char *str = NULL;
	int sizearray = tbl->sizearray;
	if (kt == LUA_TNUMBER) {
		if (!lua_isinteger(L, 2)) {
			return 0;
		}
		key = (int)lua_tointeger(L, 2);
		if (key > 0 && key <= sizearray) {
			lua_Integer i;
			for (i=key;i<sizearray;i++) {
				if (tbl->arraytype[i] != VALUETYPE_NIL) {
					lua_pushinteger(L, i+1);
					return 1;
				}
			}
			return pushfirsthash(L, tbl);
		}
		keyhash = (uint32_t)key;
		keytype = KEYTYPE_INTEGER;
	} else {
		str = luaL_checklstring(L, 2, &sz);
		keyhash = calchash(str, sz);
		keytype = KEYTYPE_STRING;
	}

	struct node *n = lookup_key(tbl, keyhash, key, keytype, str, sz);
	if (n) {
		++n;
		int index = n-tbl->hash;
		if (index == tbl->sizehash) {
			return 0;
		}
		pushkey(L, tbl->L, n);
		return 1;
	} else {
		return 0;
	}
}